

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

void createargtable(lua_State *L,char **argv,int argc,int script)

{
  ulong uVar1;
  
  lua_createtable(L,argc - (script + 1),script + 1);
  if (0 < argc) {
    uVar1 = 0;
    do {
      lua_pushstring(L,argv[uVar1]);
      lua_rawseti(L,-2,uVar1 - (long)script);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  lua_setglobal(L,"arg");
  return;
}

Assistant:

static void createargtable (lua_State *L, char **argv, int argc, int script) {
  int i, narg;
  narg = argc - (script + 1);  /* number of positive indices */
  lua_createtable(L, narg, script + 1);
  for (i = 0; i < argc; i++) {
    lua_pushstring(L, argv[i]);
    lua_rawseti(L, -2, i - script);
  }
  lua_setglobal(L, "arg");
}